

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall
kj::_::ChainPromiseNode::ChainPromiseNode
          (ChainPromiseNode *this,OwnPromiseNode *innerParam,SourceLocation location)

{
  PromiseNode *pPVar1;
  EventLoop *pEVar2;
  
  (this->super_PromiseNode).super_PromiseArenaMember.arena = (PromiseArena *)0x0;
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR___cxa_pure_virtual_0038b360;
  (this->super_Event)._vptr_Event = (_func_int **)&PTR___cxa_pure_virtual_0038ba60;
  pEVar2 = anon_unknown_173::currentEventLoop();
  (this->super_Event).loop = pEVar2;
  (this->super_Event).next = (Event *)0x0;
  (this->super_Event).prev = (Event **)0x0;
  (this->super_Event).firing = false;
  (this->super_Event).live = 0x1e366381;
  *(undefined4 *)&(this->super_Event).location.fileName = location.fileName._0_4_;
  *(undefined4 *)((long)&(this->super_Event).location.fileName + 4) = location.fileName._4_4_;
  *(undefined4 *)&(this->super_Event).location.function = location.function._0_4_;
  *(undefined4 *)((long)&(this->super_Event).location.function + 4) = location.function._4_4_;
  (this->super_Event).location.lineNumber = location.lineNumber;
  (this->super_Event).location.columnNumber = location.columnNumber;
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR_destroy_0038afc0;
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_traceEvent_0038b008;
  this->state = STEP1;
  (this->inner).ptr = innerParam->ptr;
  innerParam->ptr = (PromiseNode *)0x0;
  this->onReadyEvent = (Event *)0x0;
  this->selfPtr = (OwnPromiseNode *)0x0;
  pPVar1 = (this->inner).ptr;
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[2])(pPVar1,&this->inner);
  pPVar1 = (this->inner).ptr;
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[1])(pPVar1,&this->super_Event);
  return;
}

Assistant:

ChainPromiseNode::ChainPromiseNode(OwnPromiseNode innerParam, SourceLocation location)
    : Event(location), state(STEP1), inner(kj::mv(innerParam)) {
  inner->setSelfPointer(&inner);
  inner->onReady(this);
}